

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *This,ktx_uint32_t level)

{
  ktx_size_t kVar1;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar2 [16];
  ktx_size_t levelSize;
  ktx_uint32_t i;
  ktx_size_t levelOffset;
  ktxFormatVersionEnum in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  uint local_1c;
  ktx_size_t local_18;
  
  if (in_RDI == 0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                  ,0x683,"ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *, ktx_uint32_t)");
  }
  if (*(int *)(in_RDI + 0x88) == 0) {
    if (in_ESI < *(uint *)(in_RDI + 0x34)) {
      local_18 = 0;
      local_1c = *(uint *)(in_RDI + 0x34);
      while (local_1c = local_1c - 1, in_ESI < local_1c) {
        kVar1 = ktxTexture_calcLevelSize
                          ((ktxTexture *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (ktx_uint32_t)in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffcc = (float)*(uint *)(*(long *)(in_RDI + 0xa0) + 8);
        in_stack_ffffffffffffffd0 = (float)(long)kVar1;
        in_stack_ffffffffffffffd4 = (float)kVar1;
        auVar2 = roundss(ZEXT416((uint)(in_stack_ffffffffffffffd4 / in_stack_ffffffffffffffcc)),
                         ZEXT416((uint)(in_stack_ffffffffffffffd4 / in_stack_ffffffffffffffcc)),10);
        local_18 = ((long)(in_stack_ffffffffffffffcc * auVar2._0_4_) & 0xffffffffU) + local_18;
      }
      return local_18;
    }
    __assert_fail("level < This->numLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                  ,0x685,"ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *, ktx_uint32_t)");
  }
  __assert_fail("This->supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x684,"ktx_size_t ktxTexture2_calcLevelOffset(ktxTexture2 *, ktx_uint32_t)");
}

Assistant:

ktx_size_t
ktxTexture2_calcLevelOffset(ktxTexture2* This, ktx_uint32_t level)
{
  assert (This != NULL);
  assert(This->supercompressionScheme == KTX_SS_NONE);
  assert (level < This->numLevels);
  ktx_size_t levelOffset = 0;
  for (ktx_uint32_t i = This->numLevels - 1; i > level; i--) {
      ktx_size_t levelSize;
      levelSize = ktxTexture_calcLevelSize(ktxTexture(This), i,
                                           KTX_FORMAT_VERSION_TWO);
      levelOffset += _KTX_PADN(This->_private->_requiredLevelAlignment,
                               levelSize);
  }
  return levelOffset;
}